

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worm.c
# Opt level: O2

void place_worm_tail_randomly(monst *worm,xchar x,xchar y)

{
  byte bVar1;
  level *lev;
  boolean bVar2;
  uint uVar3;
  uint uVar4;
  char *s;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  wseg *pwVar8;
  wseg *curr;
  byte local_5c;
  wseg *local_58;
  
  bVar1 = worm->wormno;
  if (bVar1 == 0) {
    s = "place_worm_tail_randomly: worm->wormno was 0";
  }
  else {
    lev = worm->dlevel;
    local_58 = lev->wtails[bVar1];
    s = "place_worm_tail_randomly: wormno is set without a tail!";
    if ((local_58 != (wseg *)0x0) && (lev->wheads[bVar1] != (wseg *)0x0)) {
      lev->wheads[bVar1] = local_58;
      pwVar8 = local_58->nseg;
      local_58->nseg = (wseg *)0x0;
      local_58->wx = x;
      local_58->wy = y;
LAB_00275c2b:
      local_5c = y - 0x15;
      curr = pwVar8;
      do {
        if (curr == (wseg *)0x0) {
          return;
        }
        bVar7 = 0;
        do {
          uVar3 = mt_random();
          if (x < '\x02') {
            uVar3 = uVar3 & 1;
          }
          else if ((byte)x < 0x50) {
            uVar3 = uVar3 % 3 - 1;
          }
          else {
            uVar3 = -(uVar3 & 1);
          }
          if (uVar3 == 0) {
            bVar5 = (y < '\x02') * '\x02' - 1;
            if (0xec < local_5c) {
              uVar4 = mt_random();
              bVar5 = -((uVar4 & 1) == 0) | 1;
            }
          }
          else {
            uVar4 = mt_random();
            if (y < '\x02') {
              bVar5 = (byte)uVar4 & 1;
            }
            else if ((byte)y < 0x15) {
              bVar5 = (char)(uVar4 % 3) - 1;
            }
            else {
              bVar5 = -((byte)uVar4 & 1);
            }
          }
          bVar6 = (char)uVar3 + x;
          bVar5 = bVar5 + y;
          bVar2 = goodpos(lev,(int)(char)bVar6,(int)(char)bVar5,worm,0);
          if (bVar2 != '\0') {
            if (bVar7 < 0x32) {
              worm->dlevel->monsters[(char)bVar6][(char)bVar5] = worm;
              curr->wx = bVar6;
              curr->wy = bVar5;
              lev->wtails[bVar1] = curr;
              pwVar8 = curr->nseg;
              curr->nseg = local_58;
              local_58 = lev->wtails[bVar1];
              newsym((int)(char)bVar6,(int)(char)bVar5);
              x = bVar6;
              y = bVar5;
              goto LAB_00275c2b;
            }
            break;
          }
          bVar7 = bVar7 + 1;
        } while (bVar7 != 0x33);
        toss_wsegs(lev,curr,'\0');
        curr = (wseg *)0x0;
      } while( true );
    }
  }
  warning(s);
  return;
}

Assistant:

void place_worm_tail_randomly(struct monst *worm, xchar x, xchar y)
{
    int wnum = worm->wormno;
    struct level *lev = worm->dlevel;
    struct wseg *curr = lev->wtails[wnum];
    struct wseg *new_tail;
    xchar ox = x, oy = y;

    if (!wnum) {
	warning("place_worm_tail_randomly: worm->wormno was 0");
	return;
    }

    if (wnum && (!lev->wtails[wnum] || !lev->wheads[wnum]) ) {
	warning("place_worm_tail_randomly: wormno is set without a tail!");
	return;
    }

    lev->wheads[wnum] = new_tail = curr;
    curr = curr->nseg;
    new_tail->nseg = NULL;
    new_tail->wx = x;
    new_tail->wy = y;

    while (curr)  {
	xchar nx, ny;
	char tryct = 0;

	/* pick a random direction from x, y and search for goodpos() */

	do {
	    random_dir(ox, oy, &nx, &ny);
	} while (!goodpos(lev, nx, ny, worm, 0) && (tryct++ < 50));

	if (tryct < 50)  {
	    place_worm_seg(worm, nx, ny);
	    curr->wx = ox = nx;
	    curr->wy = oy = ny;
	    lev->wtails[wnum] = curr;
	    curr = curr->nseg;
	    lev->wtails[wnum]->nseg = new_tail;
	    new_tail = lev->wtails[wnum];
	    newsym(nx, ny);
	} else {			/* Oops.  Truncate because there was */
	    toss_wsegs(lev, curr, FALSE);    /* no place for the rest of it */
	    curr = NULL;
	}
    }
}